

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O3

void query_initials(char *first_name,char *last_name)

{
  int iVar1;
  char *pcVar2;
  __int32_t **pp_Var3;
  long lVar4;
  char str [1024];
  char local_438;
  char local_437;
  
  printf("What are their initials? ");
  pcVar2 = fgets(&local_438,0x400,_stdin);
  if (pcVar2 != (char *)0x0) {
    do {
      lVar4 = (long)local_438;
      if (lVar4 != 10) {
        pp_Var3 = __ctype_toupper_loc();
        iVar1 = (*pp_Var3)[lVar4];
        if ((0xffffffe5 < iVar1 - 0x5bU) && (0xffffffe5 < (*pp_Var3)[local_437] - 0x5bU)) {
          *first_name = (char)iVar1;
          *last_name = (char)(*pp_Var3)[local_437];
          return;
        }
        puts("Invalid initials!");
      }
      printf("What are their initials? ");
      pcVar2 = fgets(&local_438,0x400,_stdin);
    } while (pcVar2 != (char *)0x0);
  }
  exit(1);
}

Assistant:

void query_initials(char* first_name, char* last_name) {
  while (true) {
    char str[1024];
    printf("What are their initials? ");
    if (!fgets(str, 1024, stdin)) exit(1);
    if (str[0] == '\n') continue;
    if (
      toupper(str[0]) < 'A' || toupper(str[0]) > 'Z'
      || toupper(str[1]) < 'A' || toupper(str[1]) > 'Z'
    ) {
      printf("Invalid initials!\n");
    } else {
      *first_name = (char)toupper(str[0]);
      *last_name = (char)toupper(str[1]);
      return;
    }
  }
}